

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancy_tools.cxx
# Opt level: O1

void __thiscall fancy_tools::fix_fences(fancy_tools *this,char *section)

{
  uint uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  xr_memory_writer *this_00;
  long lVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  ulong uVar10;
  uint chunk_id;
  string raw;
  string lm;
  string base;
  string shader;
  uint32_t local_dc;
  string local_d8;
  xr_reader *local_b8;
  xr_reader *local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  char *local_88;
  undefined8 local_80;
  char local_78;
  undefined7 uStack_77;
  xr_memory_writer *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  fancy_tools *local_40;
  char *local_38;
  
  local_40 = this;
  local_38 = section;
  if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
     (iVar5 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar5 != 0)) {
    xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
    __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                 &xray_re::xr_file_system::instance::instance0,&__dso_handle);
    __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
  }
  local_b0 = xray_re::xr_file_system::r_open
                       (&xray_re::xr_file_system::instance::instance0,"$level$","level");
  if (local_b0 != (xr_reader *)0x0) {
    this_00 = (xr_memory_writer *)operator_new(0x2078);
    xray_re::xr_memory_writer::xr_memory_writer(this_00);
    local_b8 = xray_re::xr_reader::open_chunk_next(local_b0,&local_dc,(xr_reader *)0x0);
    if (local_b8 != (xr_reader *)0x0) {
      local_68 = this_00;
      do {
        xray_re::xr_writer::open_chunk(&this_00->super_xr_writer,local_dc);
        if (local_dc == 2) {
          puVar2 = (local_b8->field_2).m_p_u32;
          (local_b8->field_2).m_p = (uint8_t *)(puVar2 + 1);
          uVar1 = *puVar2;
          local_d8._M_dataplus._M_p._0_4_ = uVar1;
          (*(this_00->super_xr_writer)._vptr_xr_writer[2])(this_00,&local_d8,4);
          for (uVar10 = (ulong)uVar1; uVar10 != 0; uVar10 = uVar10 - 1) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8._M_string_length = 0;
            local_d8.field_2._M_local_buf[0] = '\0';
            local_58 = (char *)0x0;
            local_50 = 0;
            local_88 = &local_78;
            local_80 = 0;
            local_78 = '\0';
            local_a8 = &local_98;
            local_a0 = 0;
            local_98 = 0;
            local_60 = &local_50;
            xray_re::xr_reader::r_sz(local_b8,&local_d8);
            lVar6 = std::__cxx11::string::find((char)&local_d8,0x2f);
            if (lVar6 != -1) {
              std::__cxx11::string::assign((string *)&local_60,(ulong)&local_d8,0);
              uVar7 = lVar6 + 1;
              lVar6 = std::__cxx11::string::find((char)&local_d8,0x2c);
              if (lVar6 == -1) {
                psVar8 = (string *)&local_88;
              }
              else {
                std::__cxx11::string::assign((string *)&local_88,(ulong)&local_d8,uVar7);
                uVar7 = lVar6 + 1;
                psVar8 = (string *)&local_a8;
              }
              std::__cxx11::string::assign(psVar8,(ulong)&local_d8,uVar7);
              lVar6 = std::__cxx11::string::find((char *)&local_60,0x1e7140,0);
              if ((lVar6 == -1) &&
                 (bVar4 = xray_re::xr_ini_file::line_exist(local_40->m_ini,local_38,local_88), bVar4
                 )) {
                pcVar9 = "";
                if (local_a0 == 0) {
                  pcVar9 = "_v";
                }
                xray_re::msg("%s: %s -> %s%s",local_88,local_60,"def_shaders\\def_aref",pcVar9);
                std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,0x1e7140);
                if (local_a0 == 0) {
                  std::__cxx11::string::append((char *)&local_60);
                }
              }
              std::__cxx11::string::_M_assign((string *)&local_d8);
              pcVar9 = (char *)std::__cxx11::string::_M_replace_aux
                                         ((ulong)&local_d8,local_d8._M_string_length,0,'\x01');
              std::__cxx11::string::_M_append(pcVar9,(ulong)local_88);
              if (local_a0 != 0) {
                pcVar9 = (char *)std::__cxx11::string::_M_replace_aux
                                           ((ulong)&local_d8,local_d8._M_string_length,0,'\x01');
                std::__cxx11::string::_M_append(pcVar9,(ulong)local_a8);
              }
            }
            xray_re::xr_writer::w_sz(&local_68->super_xr_writer,&local_d8);
            if (local_a8 != &local_98) {
              operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
            }
            if (local_88 != &local_78) {
              operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
            }
            if (local_60 != &local_50) {
              operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                       local_d8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        else {
          puVar3 = local_b8->m_data;
          if (local_b8->m_end < puVar3) {
            __assert_fail("m_data <= m_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_reader.h"
                          ,0x7a,"size_t xray_re::xr_reader::size() const");
          }
          (*(this_00->super_xr_writer)._vptr_xr_writer[2])
                    (this_00,puVar3,(long)local_b8->m_end - (long)puVar3);
        }
        this_00 = local_68;
        xray_re::xr_writer::close_chunk(&local_68->super_xr_writer);
        local_b8 = xray_re::xr_reader::open_chunk_next(local_b0,&local_dc,local_b8);
      } while (local_b8 != (xr_reader *)0x0);
    }
    (*local_b0->_vptr_xr_reader[1])();
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"level","");
    xray_re::xr_memory_writer::save_to(this_00,"$fancy_level$",&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    (*(this_00->super_xr_writer)._vptr_xr_writer[1])(this_00);
    return;
  }
  xray_re::msg("can\'t load %s","level");
  return;
}

Assistant:

void fancy_tools::fix_fences(const char* section) const
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(PA_LEVEL, "level");
	if (r == 0) {
		msg("can't load %s", "level");
		return;
	}

	xr_memory_writer* w = new xr_memory_writer();

	unsigned chunk_id;
	for (xr_reader* s = 0; (s = r->open_chunk_next(chunk_id, s)) != 0;) {
		w->open_chunk(chunk_id);
		if (chunk_id == FSL13_SHADERS) {
			size_t n = s->r_u32();
			w->w_size_u32(n);
			while (n--) {
				std::string raw, shader, base, lm;
				s->r_sz(raw);
				std::string::size_type slash = raw.find('/'), comma;
				if (slash == std::string::npos) {
					w->w_sz(raw);
					continue;
				}
				shader.assign(raw, 0, slash);
				comma = raw.find(',', ++slash);
				if (comma == std::string::npos) {
					base.assign(raw, slash, std::string::npos);
				} else {
					base.assign(raw, slash, comma - slash);
					lm.assign(raw, ++comma, std::string::npos);
				}
				if (shader.find("def_shaders\\def_aref") == std::string::npos &&
						m_ini->line_exist(section, base.c_str())) {
					msg("%s: %s -> %s%s", base.c_str(), shader.c_str(),
							"def_shaders\\def_aref", lm.empty() ? "_v" : "");
					shader = "def_shaders\\def_aref";
					if (lm.empty())
						shader += "_v";
				}
				raw.assign(shader).append(1, '/').append(base);
				if (!lm.empty())
					raw.append(1, ',').append(lm);
				w->w_sz(raw);
			}
		} else {
			w->w_raw(s->data(), s->size());
		}
		w->close_chunk();
	}
	fs.r_close(r);
	w->save_to(PA_FANCY_LEVEL, "level");
	delete w;
}